

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *os,color3d *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *p_Var2;
  string local_90;
  string local_70;
  string local_50;
  
  this = "(";
  poVar1 = std::operator<<(os,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,(_anonymous_namespace_ *)this,v->r);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var2 = (_anonymous_namespace_ *)0x2f37b4;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var2,v->g);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var2 = (_anonymous_namespace_ *)0x2f37b4;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var2,v->b);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,")");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::color3d &v) {
  os << "(" << tinyusdz::dtos(v.r) << ", " << tinyusdz::dtos(v.g) << ", "
     << tinyusdz::dtos(v.b) << ")";
  return os;
}